

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::InnerProductLayerParams::SerializeWithCachedSizes
          (InnerProductLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  uint64 uVar2;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  InnerProductLayerParams *this_local;
  
  uVar2 = inputchannels(this);
  if (uVar2 != 0) {
    uVar2 = inputchannels(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,uVar2,output);
  }
  uVar2 = outputchannels(this);
  if (uVar2 != 0) {
    uVar2 = outputchannels(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar2,output);
  }
  bVar1 = hasbias(this);
  if (bVar1) {
    bVar1 = hasbias(this);
    google::protobuf::internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  bVar1 = has_weights(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->weights_->super_MessageLite,output);
  }
  bVar1 = has_bias(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x15,&this->bias_->super_MessageLite,output);
  }
  bVar1 = int8dynamicquantize(this);
  if (bVar1) {
    bVar1 = int8dynamicquantize(this);
    google::protobuf::internal::WireFormatLite::WriteBool(0x16,bVar1,output);
  }
  return;
}

Assistant:

void InnerProductLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.InnerProductLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 inputChannels = 1;
  if (this->inputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->inputchannels(), output);
  }

  // uint64 outputChannels = 2;
  if (this->outputchannels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->outputchannels(), output);
  }

  // bool hasBias = 10;
  if (this->hasbias() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->hasbias(), output);
  }

  // .CoreML.Specification.WeightParams weights = 20;
  if (this->has_weights()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->weights_, output);
  }

  // .CoreML.Specification.WeightParams bias = 21;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      21, *this->bias_, output);
  }

  // bool int8DynamicQuantize = 22;
  if (this->int8dynamicquantize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(22, this->int8dynamicquantize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.InnerProductLayerParams)
}